

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::GroupNorm_x86_avx::forward_inplace(GroupNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int q_1;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  float *pfVar19;
  undefined1 (*pauVar20) [32];
  undefined1 (*pauVar21) [16];
  float *gamma;
  undefined1 (*pauVar22) [32];
  int q;
  int iVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  float *beta;
  long lVar31;
  long lVar32;
  float *pfVar33;
  float fVar34;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar60;
  undefined1 auVar59 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  float fVar70;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 in_ZMM9 [64];
  float in_register_000014dc;
  
  iVar23 = bottom_top_blob->dims;
  iVar26 = (this->super_GroupNorm).group;
  uVar16 = (long)(this->super_GroupNorm).channels / (long)iVar26;
  iVar12 = (int)uVar16;
  lVar13 = (long)iVar12;
  if (iVar23 == 2) {
    iVar23 = bottom_top_blob->w;
    iVar17 = iVar23 * iVar12;
    lVar14 = 0;
    if (iVar12 < 1) {
      iVar12 = 0;
    }
    for (lVar18 = 0; lVar18 < iVar26; lVar18 = lVar18 + 1) {
      lVar27 = lVar18 * lVar13;
      pvVar3 = bottom_top_blob->data;
      pauVar22 = (undefined1 (*) [32])
                 (lVar27 * bottom_top_blob->w * bottom_top_blob->elemsize + (long)pvVar3);
      fVar43 = 0.0;
      fVar44 = 0.0;
      fVar34 = 0.0;
      fVar42 = 0.0;
      fVar45 = 0.0;
      fVar46 = 0.0;
      fVar47 = 0.0;
      fVar48 = 0.0;
      lVar30 = 0;
      pauVar20 = pauVar22;
      for (iVar26 = 0; iVar26 + 7 < iVar17; iVar26 = iVar26 + 8) {
        fVar34 = fVar34 + *(float *)*pauVar20;
        fVar42 = fVar42 + *(float *)(*pauVar20 + 4);
        fVar43 = fVar43 + *(float *)(*pauVar20 + 8);
        fVar44 = fVar44 + *(float *)(*pauVar20 + 0xc);
        fVar45 = fVar45 + *(float *)(*pauVar20 + 0x10);
        fVar46 = fVar46 + *(float *)(*pauVar20 + 0x14);
        fVar47 = fVar47 + *(float *)(*pauVar20 + 0x18);
        fVar48 = fVar48 + *(float *)(*pauVar20 + 0x1c);
        pauVar20 = pauVar20 + 1;
        lVar30 = lVar30 + 8;
      }
      pfVar19 = (float *)((long)(this->super_GroupNorm).gamma_data.data +
                         (this->super_GroupNorm).gamma_data.elemsize * lVar27);
      auVar39._0_4_ = fVar45 + fVar34;
      auVar39._4_4_ = fVar46 + fVar42;
      auVar39._8_4_ = fVar47 + fVar43;
      auVar39._12_4_ = fVar48 + fVar44;
      auVar38 = vshufpd_avx(auVar39,auVar39,1);
      auVar40._0_4_ = auVar38._0_4_ + auVar39._0_4_;
      auVar40._4_4_ = auVar38._4_4_ + auVar39._4_4_;
      auVar40._8_4_ = auVar38._8_4_ + auVar39._8_4_;
      auVar40._12_4_ = auVar38._12_4_ + auVar39._12_4_;
      auVar38 = ZEXT816(0) << 0x40;
      while( true ) {
        fVar43 = auVar38._4_4_;
        fVar44 = auVar38._8_4_;
        fVar34 = auVar38._12_4_;
        if (iVar17 <= iVar26 + 3) break;
        auVar38._0_4_ = auVar38._0_4_ + *(float *)*pauVar20;
        auVar38._4_4_ = fVar43 + *(float *)(*pauVar20 + 4);
        auVar38._8_4_ = fVar44 + *(float *)(*pauVar20 + 8);
        auVar38._12_4_ = fVar34 + *(float *)(*pauVar20 + 0xc);
        pauVar20 = (undefined1 (*) [32])(*pauVar20 + 0x10);
        iVar26 = iVar26 + 4;
        lVar30 = lVar30 + 4;
      }
      auVar39 = vshufpd_avx(auVar38,auVar38,1);
      auVar51._0_4_ = auVar39._0_4_ + auVar38._0_4_;
      auVar51._4_4_ = auVar39._4_4_ + fVar43;
      auVar51._8_4_ = auVar39._8_4_ + fVar44;
      auVar51._12_4_ = auVar39._12_4_ + fVar34;
      auVar39 = vmovshdup_avx(auVar51);
      auVar38 = vhaddps_avx(auVar40,auVar40);
      fVar43 = auVar38._0_4_ + auVar39._0_4_ + auVar51._0_4_;
      lVar28 = bottom_top_blob->elemsize * lVar14 * (long)bottom_top_blob->w;
      for (; (int)lVar30 < iVar17; lVar30 = lVar30 + 1) {
        fVar43 = fVar43 + *(float *)((long)pvVar3 + lVar30 * 4 + lVar28);
      }
      fVar43 = fVar43 * (1.0 / (float)iVar17);
      auVar38 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
      auVar66._16_16_ = auVar38;
      auVar66._0_16_ = auVar38;
      lVar30 = 0;
      fVar44 = 0.0;
      fVar34 = 0.0;
      fVar42 = 0.0;
      fVar45 = 0.0;
      fVar46 = 0.0;
      fVar47 = 0.0;
      fVar48 = 0.0;
      fVar60 = 0.0;
      pauVar20 = pauVar22;
      for (iVar26 = 0; iVar26 + 7 < iVar17; iVar26 = iVar26 + 8) {
        auVar78 = vsubps_avx(*pauVar20,auVar66);
        fVar44 = auVar78._0_4_ * auVar78._0_4_ + fVar44;
        fVar34 = auVar78._4_4_ * auVar78._4_4_ + fVar34;
        fVar42 = auVar78._8_4_ * auVar78._8_4_ + fVar42;
        fVar45 = auVar78._12_4_ * auVar78._12_4_ + fVar45;
        fVar46 = auVar78._16_4_ * auVar78._16_4_ + fVar46;
        fVar47 = auVar78._20_4_ * auVar78._20_4_ + fVar47;
        fVar48 = auVar78._24_4_ * auVar78._24_4_ + fVar48;
        fVar60 = auVar78._28_4_ + fVar60;
        pauVar20 = pauVar20 + 1;
        lVar30 = lVar30 + 8;
      }
      auVar57._0_4_ = fVar46 + fVar44;
      auVar57._4_4_ = fVar47 + fVar34;
      auVar57._8_4_ = fVar48 + fVar42;
      auVar57._12_4_ = fVar60 + fVar45;
      auVar39 = vshufpd_avx(auVar57,auVar57,1);
      auVar58._0_4_ = auVar39._0_4_ + auVar57._0_4_;
      auVar58._4_4_ = auVar39._4_4_ + auVar57._4_4_;
      auVar58._8_4_ = auVar39._8_4_ + auVar57._8_4_;
      auVar58._12_4_ = auVar39._12_4_ + auVar57._12_4_;
      auVar62 = ZEXT816(0) << 0x40;
      while( true ) {
        fVar44 = auVar62._4_4_;
        fVar34 = auVar62._8_4_;
        fVar42 = auVar62._12_4_;
        if (iVar17 <= iVar26 + 3) break;
        auVar39 = vsubps_avx(*(undefined1 (*) [16])*pauVar20,auVar38);
        auVar62._0_4_ = auVar39._0_4_ * auVar39._0_4_ + auVar62._0_4_;
        auVar62._4_4_ = auVar39._4_4_ * auVar39._4_4_ + fVar44;
        auVar62._8_4_ = auVar39._8_4_ * auVar39._8_4_ + fVar34;
        auVar62._12_4_ = auVar39._12_4_ * auVar39._12_4_ + fVar42;
        pauVar20 = (undefined1 (*) [32])(*pauVar20 + 0x10);
        iVar26 = iVar26 + 4;
        lVar30 = lVar30 + 4;
      }
      auVar39 = vshufpd_avx(auVar62,auVar62,1);
      auVar38 = vhaddps_avx(auVar58,auVar58);
      auVar41._0_4_ = auVar39._0_4_ + auVar62._0_4_;
      auVar41._4_4_ = auVar39._4_4_ + fVar44;
      auVar41._8_4_ = auVar39._8_4_ + fVar34;
      auVar41._12_4_ = auVar39._12_4_ + fVar42;
      auVar39 = vmovshdup_avx(auVar41);
      fVar44 = auVar38._0_4_ + auVar39._0_4_ + auVar41._0_4_;
      for (; (int)lVar30 < iVar17; lVar30 = lVar30 + 1) {
        fVar34 = *(float *)((long)pvVar3 + lVar30 * 4 + lVar28) - fVar43;
        fVar44 = fVar34 * fVar34 + fVar44;
      }
      auVar38 = ZEXT416((uint)(fVar44 * (1.0 / (float)iVar17) + (this->super_GroupNorm).eps));
      auVar38 = vsqrtss_avx(auVar38,auVar38);
      fVar44 = 1.0 / auVar38._0_4_;
      fVar43 = fVar44 * -fVar43;
      if ((this->super_GroupNorm).affine == 0) {
        auVar38 = vshufps_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44),0);
        auVar39 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
        lVar27 = 0;
        iVar26 = 0;
        while( true ) {
          fVar47 = auVar38._0_4_;
          fVar48 = auVar38._4_4_;
          fVar60 = auVar38._8_4_;
          fVar34 = auVar39._0_4_;
          fVar42 = auVar39._4_4_;
          fVar45 = auVar39._8_4_;
          fVar46 = auVar39._12_4_;
          if (iVar17 <= iVar26 + 7) break;
          auVar78._0_4_ = fVar47 * *(float *)*pauVar22 + fVar34;
          auVar78._4_4_ = fVar48 * *(float *)(*pauVar22 + 4) + fVar42;
          auVar78._8_4_ = fVar60 * *(float *)(*pauVar22 + 8) + fVar45;
          auVar78._12_4_ = auVar38._12_4_ * *(float *)(*pauVar22 + 0xc) + fVar46;
          auVar78._16_4_ = fVar47 * *(float *)(*pauVar22 + 0x10) + fVar34;
          auVar78._20_4_ = fVar48 * *(float *)(*pauVar22 + 0x14) + fVar42;
          auVar78._24_4_ = fVar60 * *(float *)(*pauVar22 + 0x18) + fVar45;
          auVar78._28_4_ = in_ZMM9._28_4_ + fVar46;
          in_ZMM9 = ZEXT3264(auVar78);
          *pauVar22 = auVar78;
          pauVar22 = pauVar22 + 1;
          iVar26 = iVar26 + 8;
          lVar27 = lVar27 + 8;
        }
        for (; iVar26 + 3 < iVar17; iVar26 = iVar26 + 4) {
          auVar67._0_4_ = fVar47 * *(float *)*pauVar22 + fVar34;
          auVar67._4_4_ = fVar48 * *(float *)(*pauVar22 + 4) + fVar42;
          auVar67._8_4_ = fVar60 * *(float *)(*pauVar22 + 8) + fVar45;
          auVar67._12_4_ = auVar38._12_4_ * *(float *)(*pauVar22 + 0xc) + fVar46;
          *(undefined1 (*) [16])*pauVar22 = auVar67;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          lVar27 = lVar27 + 4;
        }
        for (; (int)lVar27 < iVar17; lVar27 = lVar27 + 1) {
          *(float *)((long)pvVar3 + lVar27 * 4 + lVar28) =
               fVar44 * *(float *)((long)pvVar3 + lVar27 * 4 + lVar28) + fVar43;
        }
      }
      else {
        pfVar33 = (float *)((long)(this->super_GroupNorm).beta_data.data +
                           lVar27 * (this->super_GroupNorm).beta_data.elemsize);
        for (iVar26 = 0; iVar26 != iVar12; iVar26 = iVar26 + 1) {
          fVar42 = *pfVar19 * fVar44;
          fVar34 = *pfVar19 * fVar43 + *pfVar33;
          auVar38 = vshufps_avx(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42),0);
          in_ZMM9 = ZEXT3264(CONCAT1616(auVar38,auVar38));
          auVar39 = vshufps_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34),0);
          iVar25 = 0;
          while( true ) {
            fVar60 = auVar38._0_4_;
            fVar54 = auVar38._4_4_;
            fVar71 = auVar38._8_4_;
            fVar45 = auVar39._0_4_;
            fVar46 = auVar39._4_4_;
            fVar47 = auVar39._8_4_;
            fVar48 = auVar39._12_4_;
            if (iVar23 <= iVar25 + 7) break;
            fVar70 = *(float *)(*pauVar22 + 4);
            fVar6 = *(float *)(*pauVar22 + 8);
            fVar7 = *(float *)(*pauVar22 + 0xc);
            fVar8 = *(float *)(*pauVar22 + 0x10);
            fVar9 = *(float *)(*pauVar22 + 0x14);
            fVar10 = *(float *)(*pauVar22 + 0x18);
            in_register_000014dc = in_register_000014dc + fVar48;
            *(float *)*pauVar22 = fVar60 * *(float *)*pauVar22 + fVar45;
            *(float *)(*pauVar22 + 4) = fVar54 * fVar70 + fVar46;
            *(float *)(*pauVar22 + 8) = fVar71 * fVar6 + fVar47;
            *(float *)(*pauVar22 + 0xc) = auVar38._12_4_ * fVar7 + fVar48;
            *(float *)(*pauVar22 + 0x10) = fVar60 * fVar8 + fVar45;
            *(float *)(*pauVar22 + 0x14) = fVar54 * fVar9 + fVar46;
            *(float *)(*pauVar22 + 0x18) = fVar71 * fVar10 + fVar47;
            *(float *)(*pauVar22 + 0x1c) = in_register_000014dc;
            pauVar22 = pauVar22 + 1;
            iVar25 = iVar25 + 8;
          }
          for (; iVar25 + 3 < iVar23; iVar25 = iVar25 + 4) {
            auVar72._0_4_ = fVar60 * *(float *)*pauVar22 + fVar45;
            auVar72._4_4_ = fVar54 * *(float *)(*pauVar22 + 4) + fVar46;
            auVar72._8_4_ = fVar71 * *(float *)(*pauVar22 + 8) + fVar47;
            auVar72._12_4_ = auVar38._12_4_ * *(float *)(*pauVar22 + 0xc) + fVar48;
            in_ZMM9 = ZEXT1664(auVar72);
            *(undefined1 (*) [16])*pauVar22 = auVar72;
            pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          }
          for (; iVar25 < iVar23; iVar25 = iVar25 + 1) {
            *(float *)*pauVar22 = fVar42 * *(float *)*pauVar22 + fVar34;
            pauVar22 = (undefined1 (*) [32])(*pauVar22 + 4);
          }
          pfVar19 = pfVar19 + 1;
          pfVar33 = pfVar33 + 1;
        }
      }
      iVar26 = (this->super_GroupNorm).group;
      lVar14 = lVar14 + lVar13;
    }
  }
  else if (iVar23 == 1) {
    lVar14 = 0;
    for (lVar18 = 0; lVar18 < iVar26; lVar18 = lVar18 + 1) {
      pvVar3 = bottom_top_blob->data;
      pauVar22 = (undefined1 (*) [32])(lVar18 * lVar13 * bottom_top_blob->elemsize + (long)pvVar3);
      pvVar4 = (this->super_GroupNorm).gamma_data.data;
      pvVar5 = (this->super_GroupNorm).beta_data.data;
      lVar27 = 0;
      fVar43 = 0.0;
      fVar44 = 0.0;
      fVar34 = 0.0;
      fVar42 = 0.0;
      fVar45 = 0.0;
      fVar46 = 0.0;
      fVar47 = 0.0;
      fVar48 = 0.0;
      pauVar20 = pauVar22;
      for (iVar23 = 0; iVar23 + 7 < iVar12; iVar23 = iVar23 + 8) {
        fVar34 = fVar34 + *(float *)*pauVar20;
        fVar42 = fVar42 + *(float *)(*pauVar20 + 4);
        fVar43 = fVar43 + *(float *)(*pauVar20 + 8);
        fVar44 = fVar44 + *(float *)(*pauVar20 + 0xc);
        fVar45 = fVar45 + *(float *)(*pauVar20 + 0x10);
        fVar46 = fVar46 + *(float *)(*pauVar20 + 0x14);
        fVar47 = fVar47 + *(float *)(*pauVar20 + 0x18);
        fVar48 = fVar48 + *(float *)(*pauVar20 + 0x1c);
        pauVar20 = pauVar20 + 1;
        lVar27 = lVar27 + 8;
      }
      auVar35._0_4_ = fVar45 + fVar34;
      auVar35._4_4_ = fVar46 + fVar42;
      auVar35._8_4_ = fVar47 + fVar43;
      auVar35._12_4_ = fVar48 + fVar44;
      auVar38 = vshufpd_avx(auVar35,auVar35,1);
      auVar36._0_4_ = auVar38._0_4_ + auVar35._0_4_;
      auVar36._4_4_ = auVar38._4_4_ + auVar35._4_4_;
      auVar36._8_4_ = auVar38._8_4_ + auVar35._8_4_;
      auVar36._12_4_ = auVar38._12_4_ + auVar35._12_4_;
      auVar49 = ZEXT816(0) << 0x40;
      while( true ) {
        fVar43 = auVar49._4_4_;
        fVar44 = auVar49._8_4_;
        fVar34 = auVar49._12_4_;
        if (iVar12 <= iVar23 + 3) break;
        auVar49._0_4_ = auVar49._0_4_ + *(float *)*pauVar20;
        auVar49._4_4_ = fVar43 + *(float *)(*pauVar20 + 4);
        auVar49._8_4_ = fVar44 + *(float *)(*pauVar20 + 8);
        auVar49._12_4_ = fVar34 + *(float *)(*pauVar20 + 0xc);
        pauVar20 = (undefined1 (*) [32])(*pauVar20 + 0x10);
        iVar23 = iVar23 + 4;
        lVar27 = lVar27 + 4;
      }
      auVar38 = vshufpd_avx(auVar49,auVar49,1);
      auVar50._0_4_ = auVar38._0_4_ + auVar49._0_4_;
      auVar50._4_4_ = auVar38._4_4_ + fVar43;
      auVar50._8_4_ = auVar38._8_4_ + fVar44;
      auVar50._12_4_ = auVar38._12_4_ + fVar34;
      auVar39 = vmovshdup_avx(auVar50);
      auVar38 = vhaddps_avx(auVar36,auVar36);
      fVar43 = auVar38._0_4_ + auVar39._0_4_ + auVar50._0_4_;
      lVar30 = bottom_top_blob->elemsize * lVar14;
      for (; (int)lVar27 < iVar12; lVar27 = lVar27 + 1) {
        fVar43 = fVar43 + *(float *)((long)pvVar3 + lVar27 * 4 + lVar30);
      }
      fVar43 = fVar43 * (1.0 / (float)iVar12);
      auVar38 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
      auVar65._16_16_ = auVar38;
      auVar65._0_16_ = auVar38;
      lVar27 = 0;
      fVar44 = 0.0;
      fVar34 = 0.0;
      fVar42 = 0.0;
      fVar45 = 0.0;
      fVar46 = 0.0;
      fVar47 = 0.0;
      fVar48 = 0.0;
      fVar60 = 0.0;
      pauVar20 = pauVar22;
      for (iVar23 = 0; iVar23 + 7 < iVar12; iVar23 = iVar23 + 8) {
        auVar66 = vsubps_avx(*pauVar20,auVar65);
        fVar44 = auVar66._0_4_ * auVar66._0_4_ + fVar44;
        fVar34 = auVar66._4_4_ * auVar66._4_4_ + fVar34;
        fVar42 = auVar66._8_4_ * auVar66._8_4_ + fVar42;
        fVar45 = auVar66._12_4_ * auVar66._12_4_ + fVar45;
        fVar46 = auVar66._16_4_ * auVar66._16_4_ + fVar46;
        fVar47 = auVar66._20_4_ * auVar66._20_4_ + fVar47;
        fVar48 = auVar66._24_4_ * auVar66._24_4_ + fVar48;
        fVar60 = auVar66._28_4_ + fVar60;
        pauVar20 = pauVar20 + 1;
        lVar27 = lVar27 + 8;
      }
      auVar55._0_4_ = fVar46 + fVar44;
      auVar55._4_4_ = fVar47 + fVar34;
      auVar55._8_4_ = fVar48 + fVar42;
      auVar55._12_4_ = fVar60 + fVar45;
      auVar39 = vshufpd_avx(auVar55,auVar55,1);
      auVar56._0_4_ = auVar39._0_4_ + auVar55._0_4_;
      auVar56._4_4_ = auVar39._4_4_ + auVar55._4_4_;
      auVar56._8_4_ = auVar39._8_4_ + auVar55._8_4_;
      auVar56._12_4_ = auVar39._12_4_ + auVar55._12_4_;
      auVar61 = ZEXT816(0) << 0x40;
      while( true ) {
        fVar44 = auVar61._4_4_;
        fVar34 = auVar61._8_4_;
        fVar42 = auVar61._12_4_;
        if (iVar12 <= iVar23 + 3) break;
        auVar39 = vsubps_avx(*(undefined1 (*) [16])*pauVar20,auVar38);
        auVar61._0_4_ = auVar39._0_4_ * auVar39._0_4_ + auVar61._0_4_;
        auVar61._4_4_ = auVar39._4_4_ * auVar39._4_4_ + fVar44;
        auVar61._8_4_ = auVar39._8_4_ * auVar39._8_4_ + fVar34;
        auVar61._12_4_ = auVar39._12_4_ * auVar39._12_4_ + fVar42;
        pauVar20 = (undefined1 (*) [32])(*pauVar20 + 0x10);
        iVar23 = iVar23 + 4;
        lVar27 = lVar27 + 4;
      }
      auVar39 = vshufpd_avx(auVar61,auVar61,1);
      auVar38 = vhaddps_avx(auVar56,auVar56);
      auVar37._0_4_ = auVar39._0_4_ + auVar61._0_4_;
      auVar37._4_4_ = auVar39._4_4_ + fVar44;
      auVar37._8_4_ = auVar39._8_4_ + fVar34;
      auVar37._12_4_ = auVar39._12_4_ + fVar42;
      auVar39 = vmovshdup_avx(auVar37);
      fVar44 = auVar38._0_4_ + auVar39._0_4_ + auVar37._0_4_;
      for (; (int)lVar27 < iVar12; lVar27 = lVar27 + 1) {
        fVar34 = *(float *)((long)pvVar3 + lVar27 * 4 + lVar30) - fVar43;
        fVar44 = fVar34 * fVar34 + fVar44;
      }
      auVar38 = ZEXT416((uint)(fVar44 * (1.0 / (float)iVar12) + (this->super_GroupNorm).eps));
      auVar38 = vsqrtss_avx(auVar38,auVar38);
      fVar44 = 1.0 / auVar38._0_4_;
      auVar38 = ZEXT416((uint)fVar44);
      fVar43 = fVar44 * -fVar43;
      if ((this->super_GroupNorm).affine == 0) {
        auVar38 = vshufps_avx(auVar38,auVar38,0);
        auVar39 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
        lVar27 = 0;
        iVar23 = 0;
        while( true ) {
          fVar34 = auVar39._0_4_;
          fVar42 = auVar39._4_4_;
          fVar45 = auVar39._8_4_;
          fVar46 = auVar39._12_4_;
          fVar47 = auVar38._0_4_;
          fVar48 = auVar38._4_4_;
          fVar60 = auVar38._8_4_;
          if (iVar12 <= iVar23 + 7) break;
          auVar77._0_4_ = fVar47 * *(float *)*pauVar22 + fVar34;
          auVar77._4_4_ = fVar48 * *(float *)(*pauVar22 + 4) + fVar42;
          auVar77._8_4_ = fVar60 * *(float *)(*pauVar22 + 8) + fVar45;
          auVar77._12_4_ = auVar38._12_4_ * *(float *)(*pauVar22 + 0xc) + fVar46;
          auVar77._16_4_ = fVar47 * *(float *)(*pauVar22 + 0x10) + fVar34;
          auVar77._20_4_ = fVar48 * *(float *)(*pauVar22 + 0x14) + fVar42;
          auVar77._24_4_ = fVar60 * *(float *)(*pauVar22 + 0x18) + fVar45;
          auVar77._28_4_ = in_ZMM9._28_4_ + fVar46;
          in_ZMM9 = ZEXT3264(auVar77);
          *pauVar22 = auVar77;
          pauVar22 = pauVar22 + 1;
          iVar23 = iVar23 + 8;
          lVar27 = lVar27 + 8;
        }
        for (; iVar23 + 3 < iVar12; iVar23 = iVar23 + 4) {
          fVar54 = *(float *)(*pauVar22 + 4);
          fVar71 = *(float *)(*pauVar22 + 8);
          fVar70 = *(float *)(*pauVar22 + 0xc);
          *(float *)*pauVar22 = fVar47 * *(float *)*pauVar22 + fVar34;
          *(float *)(*pauVar22 + 4) = fVar48 * fVar54 + fVar42;
          *(float *)(*pauVar22 + 8) = fVar60 * fVar71 + fVar45;
          *(float *)(*pauVar22 + 0xc) = auVar38._12_4_ * fVar70 + fVar46;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          lVar27 = lVar27 + 4;
        }
        for (; (int)lVar27 < iVar12; lVar27 = lVar27 + 1) {
          *(float *)((long)pvVar3 + lVar27 * 4 + lVar30) =
               fVar44 * *(float *)((long)pvVar3 + lVar27 * 4 + lVar30) + fVar43;
        }
      }
      else {
        auVar38 = vshufps_avx(auVar38,auVar38,0);
        auVar39 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
        lVar32 = (this->super_GroupNorm).beta_data.elemsize * lVar14;
        lVar31 = (this->super_GroupNorm).gamma_data.elemsize * lVar14;
        lVar28 = 0;
        lVar27 = 0;
        iVar23 = 0;
        while( true ) {
          fVar34 = auVar39._0_4_;
          fVar42 = auVar39._4_4_;
          fVar45 = auVar39._8_4_;
          fVar46 = auVar39._12_4_;
          fVar47 = auVar38._0_4_;
          fVar48 = auVar38._4_4_;
          fVar60 = auVar38._8_4_;
          if (iVar12 <= iVar23 + 7) break;
          pfVar19 = (float *)((long)pvVar3 + lVar27 + lVar30);
          pfVar33 = (float *)((long)pvVar4 + lVar27 + lVar31);
          pfVar1 = (float *)((long)pvVar5 + lVar27 + lVar32);
          auVar76._0_4_ = (fVar47 * *pfVar19 + fVar34) * *pfVar33 + *pfVar1;
          auVar76._4_4_ = (fVar48 * pfVar19[1] + fVar42) * pfVar33[1] + pfVar1[1];
          auVar76._8_4_ = (fVar60 * pfVar19[2] + fVar45) * pfVar33[2] + pfVar1[2];
          auVar76._12_4_ = (auVar38._12_4_ * pfVar19[3] + fVar46) * pfVar33[3] + pfVar1[3];
          auVar76._16_4_ = (fVar47 * pfVar19[4] + fVar34) * pfVar33[4] + pfVar1[4];
          auVar76._20_4_ = (fVar48 * pfVar19[5] + fVar42) * pfVar33[5] + pfVar1[5];
          auVar76._24_4_ = (fVar60 * pfVar19[6] + fVar45) * pfVar33[6] + pfVar1[6];
          auVar76._28_4_ = in_ZMM9._28_4_ + fVar46 + pfVar1[7];
          in_ZMM9 = ZEXT3264(auVar76);
          *(undefined1 (*) [32])((long)pvVar3 + lVar27 + lVar30) = auVar76;
          iVar23 = iVar23 + 8;
          lVar27 = lVar27 + 0x20;
          lVar28 = lVar28 + 8;
        }
        for (; iVar23 + 3 < iVar12; iVar23 = iVar23 + 4) {
          pfVar19 = (float *)((long)pvVar3 + lVar27 + lVar30);
          fVar54 = pfVar19[1];
          fVar71 = pfVar19[2];
          fVar70 = pfVar19[3];
          pfVar33 = (float *)((long)pvVar4 + lVar27 + lVar31);
          fVar6 = pfVar33[1];
          fVar7 = pfVar33[2];
          fVar8 = pfVar33[3];
          pfVar1 = (float *)((long)pvVar5 + lVar27 + lVar32);
          fVar9 = pfVar1[1];
          fVar10 = pfVar1[2];
          fVar11 = pfVar1[3];
          pfVar2 = (float *)((long)pvVar3 + lVar27 + lVar30);
          *pfVar2 = (fVar47 * *pfVar19 + fVar34) * *pfVar33 + *pfVar1;
          pfVar2[1] = (fVar48 * fVar54 + fVar42) * fVar6 + fVar9;
          pfVar2[2] = (fVar60 * fVar71 + fVar45) * fVar7 + fVar10;
          pfVar2[3] = (auVar38._12_4_ * fVar70 + fVar46) * fVar8 + fVar11;
          lVar27 = lVar27 + 0x10;
          lVar28 = lVar28 + 4;
        }
        for (; (int)lVar28 < iVar12; lVar28 = lVar28 + 1) {
          *(float *)((long)pvVar3 + lVar28 * 4 + lVar30) =
               (fVar44 * *(float *)((long)pvVar3 + lVar28 * 4 + lVar30) + fVar43) *
               *(float *)((long)pvVar4 + lVar28 * 4 + lVar31) +
               *(float *)((long)pvVar5 + lVar28 * 4 + lVar32);
        }
      }
      iVar26 = (this->super_GroupNorm).group;
      lVar14 = lVar14 + lVar13;
    }
  }
  else if (iVar23 - 3U < 2) {
    iVar23 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    uVar29 = 0;
    uVar16 = uVar16 & 0xffffffff;
    if (iVar12 < 1) {
      uVar16 = uVar29;
    }
    fVar43 = 1.0 / (float)(iVar23 * iVar12);
    for (; (long)uVar29 < (long)iVar26; uVar29 = uVar29 + 1) {
      lVar27 = uVar29 * lVar13;
      uVar15 = bottom_top_blob->elemsize;
      lVar14 = bottom_top_blob->cstep * lVar27 * uVar15;
      pvVar3 = bottom_top_blob->data;
      uVar24 = (long)bottom_top_blob->d * uVar15 *
               (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0;
      lVar18 = uVar24 - uVar24 % uVar15;
      fVar44 = 0.0;
      for (uVar15 = 0; uVar15 != uVar16; uVar15 = uVar15 + 1) {
        pfVar19 = (float *)((long)pvVar3 + lVar18 * uVar15 + lVar14);
        fVar34 = 0.0;
        fVar42 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        fVar48 = 0.0;
        fVar60 = 0.0;
        fVar54 = 0.0;
        for (iVar26 = 0; iVar26 + 7 < iVar23; iVar26 = iVar26 + 8) {
          fVar45 = fVar45 + *pfVar19;
          fVar46 = fVar46 + pfVar19[1];
          fVar34 = fVar34 + pfVar19[2];
          fVar42 = fVar42 + pfVar19[3];
          fVar47 = fVar47 + pfVar19[4];
          fVar48 = fVar48 + pfVar19[5];
          fVar60 = fVar60 + pfVar19[6];
          fVar54 = fVar54 + pfVar19[7];
          pfVar19 = pfVar19 + 8;
        }
        auVar52._0_4_ = fVar47 + fVar45;
        auVar52._4_4_ = fVar48 + fVar46;
        auVar52._8_4_ = fVar60 + fVar34;
        auVar52._12_4_ = fVar54 + fVar42;
        auVar38 = vshufpd_avx(auVar52,auVar52,1);
        auVar53._0_4_ = auVar38._0_4_ + auVar52._0_4_;
        auVar53._4_4_ = auVar38._4_4_ + auVar52._4_4_;
        auVar53._8_4_ = auVar38._8_4_ + auVar52._8_4_;
        auVar53._12_4_ = auVar38._12_4_ + auVar52._12_4_;
        auVar38 = vmovshdup_avx(auVar53);
        auVar63 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar34 = auVar63._4_4_;
          fVar42 = auVar63._8_4_;
          fVar45 = auVar63._12_4_;
          if (iVar23 <= iVar26 + 3) break;
          auVar63._0_4_ = auVar63._0_4_ + *pfVar19;
          auVar63._4_4_ = fVar34 + pfVar19[1];
          auVar63._8_4_ = fVar42 + pfVar19[2];
          auVar63._12_4_ = fVar45 + pfVar19[3];
          pfVar19 = pfVar19 + 4;
          iVar26 = iVar26 + 4;
        }
        auVar39 = vshufpd_avx(auVar63,auVar63,1);
        auVar64._0_4_ = auVar39._0_4_ + auVar63._0_4_;
        auVar64._4_4_ = auVar39._4_4_ + fVar34;
        auVar64._8_4_ = auVar39._8_4_ + fVar42;
        auVar64._12_4_ = auVar39._12_4_ + fVar45;
        auVar39 = vmovshdup_avx(auVar64);
        fVar44 = auVar38._0_4_ + fVar44 + auVar53._0_4_ + auVar39._0_4_ + auVar64._0_4_;
        for (; iVar26 < iVar23; iVar26 = iVar26 + 1) {
          fVar44 = fVar44 + *pfVar19;
          pfVar19 = pfVar19 + 1;
        }
      }
      pfVar19 = (float *)((long)(this->super_GroupNorm).gamma_data.data +
                         (this->super_GroupNorm).gamma_data.elemsize * lVar27);
      fVar44 = fVar44 * fVar43;
      auVar38 = vshufps_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44),0);
      auVar59._16_16_ = auVar38;
      auVar59._0_16_ = auVar38;
      fVar34 = 0.0;
      for (uVar15 = 0; uVar15 != uVar16; uVar15 = uVar15 + 1) {
        pauVar20 = (undefined1 (*) [32])((long)pvVar3 + lVar18 * uVar15 + lVar14);
        fVar42 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        fVar48 = 0.0;
        fVar60 = 0.0;
        fVar54 = 0.0;
        fVar71 = 0.0;
        for (iVar26 = 0; iVar26 + 7 < iVar23; iVar26 = iVar26 + 8) {
          auVar66 = vsubps_avx(*pauVar20,auVar59);
          fVar46 = auVar66._0_4_ * auVar66._0_4_ + fVar46;
          fVar47 = auVar66._4_4_ * auVar66._4_4_ + fVar47;
          fVar42 = auVar66._8_4_ * auVar66._8_4_ + fVar42;
          fVar45 = auVar66._12_4_ * auVar66._12_4_ + fVar45;
          fVar48 = auVar66._16_4_ * auVar66._16_4_ + fVar48;
          fVar60 = auVar66._20_4_ * auVar66._20_4_ + fVar60;
          fVar54 = auVar66._24_4_ * auVar66._24_4_ + fVar54;
          fVar71 = auVar66._28_4_ + fVar71;
          pauVar20 = pauVar20 + 1;
        }
        auVar68._0_4_ = fVar48 + fVar46;
        auVar68._4_4_ = fVar60 + fVar47;
        auVar68._8_4_ = fVar54 + fVar42;
        auVar68._12_4_ = fVar71 + fVar45;
        auVar39 = vshufpd_avx(auVar68,auVar68,1);
        auVar69._0_4_ = auVar39._0_4_ + auVar68._0_4_;
        auVar69._4_4_ = auVar39._4_4_ + auVar68._4_4_;
        auVar69._8_4_ = auVar39._8_4_ + auVar68._8_4_;
        auVar69._12_4_ = auVar39._12_4_ + auVar68._12_4_;
        auVar39 = vmovshdup_avx(auVar69);
        auVar73 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar42 = auVar73._4_4_;
          fVar45 = auVar73._8_4_;
          fVar46 = auVar73._12_4_;
          if (iVar23 <= iVar26 + 3) break;
          auVar40 = vsubps_avx(*(undefined1 (*) [16])*pauVar20,auVar38);
          auVar73._0_4_ = auVar40._0_4_ * auVar40._0_4_ + auVar73._0_4_;
          auVar73._4_4_ = auVar40._4_4_ * auVar40._4_4_ + fVar42;
          auVar73._8_4_ = auVar40._8_4_ * auVar40._8_4_ + fVar45;
          auVar73._12_4_ = auVar40._12_4_ * auVar40._12_4_ + fVar46;
          pauVar20 = (undefined1 (*) [32])(*pauVar20 + 0x10);
          iVar26 = iVar26 + 4;
        }
        auVar40 = vshufpd_avx(auVar73,auVar73,1);
        auVar74._0_4_ = auVar40._0_4_ + auVar73._0_4_;
        auVar74._4_4_ = auVar40._4_4_ + fVar42;
        auVar74._8_4_ = auVar40._8_4_ + fVar45;
        auVar74._12_4_ = auVar40._12_4_ + fVar46;
        auVar40 = vmovshdup_avx(auVar74);
        fVar34 = auVar39._0_4_ + fVar34 + auVar69._0_4_ + auVar40._0_4_ + auVar74._0_4_;
        for (; iVar26 < iVar23; iVar26 = iVar26 + 1) {
          fVar42 = *(float *)*pauVar20 - fVar44;
          fVar34 = fVar42 * fVar42 + fVar34;
          pauVar20 = (undefined1 (*) [32])(*pauVar20 + 4);
        }
      }
      pfVar33 = (float *)((long)(this->super_GroupNorm).beta_data.data +
                         lVar27 * (this->super_GroupNorm).beta_data.elemsize);
      auVar38 = ZEXT416((uint)(fVar34 * fVar43 + (this->super_GroupNorm).eps));
      auVar38 = vsqrtss_avx(auVar38,auVar38);
      fVar34 = 1.0 / auVar38._0_4_;
      for (uVar15 = 0; uVar15 != uVar16; uVar15 = uVar15 + 1) {
        fVar42 = fVar34 * -fVar44;
        fVar45 = fVar34;
        if ((this->super_GroupNorm).affine != 0) {
          fVar45 = *pfVar19 * fVar34;
          fVar42 = *pfVar19 * fVar34 * -fVar44 + *pfVar33;
        }
        pauVar21 = (undefined1 (*) [16])((long)pvVar3 + lVar18 * uVar15 + lVar14);
        auVar38 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
        auVar39 = vshufps_avx(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42),0);
        iVar26 = 0;
        while( true ) {
          fVar54 = auVar38._0_4_;
          fVar71 = auVar38._4_4_;
          fVar70 = auVar38._8_4_;
          fVar46 = auVar39._0_4_;
          fVar47 = auVar39._4_4_;
          fVar48 = auVar39._8_4_;
          fVar60 = auVar39._12_4_;
          if (iVar23 <= iVar26 + 7) break;
          fVar6 = *(float *)(*pauVar21 + 4);
          fVar7 = *(float *)(*pauVar21 + 8);
          fVar8 = *(float *)(*pauVar21 + 0xc);
          fVar9 = *(float *)pauVar21[1];
          fVar10 = *(float *)(pauVar21[1] + 4);
          fVar11 = *(float *)(pauVar21[1] + 8);
          in_register_000014dc = in_register_000014dc + fVar60;
          *(float *)*pauVar21 = fVar54 * *(float *)*pauVar21 + fVar46;
          *(float *)(*pauVar21 + 4) = fVar71 * fVar6 + fVar47;
          *(float *)(*pauVar21 + 8) = fVar70 * fVar7 + fVar48;
          *(float *)(*pauVar21 + 0xc) = auVar38._12_4_ * fVar8 + fVar60;
          *(float *)pauVar21[1] = fVar54 * fVar9 + fVar46;
          *(float *)(pauVar21[1] + 4) = fVar71 * fVar10 + fVar47;
          *(float *)(pauVar21[1] + 8) = fVar70 * fVar11 + fVar48;
          *(float *)(pauVar21[1] + 0xc) = in_register_000014dc;
          pauVar21 = pauVar21 + 2;
          iVar26 = iVar26 + 8;
        }
        for (; iVar26 + 3 < iVar23; iVar26 = iVar26 + 4) {
          auVar75._0_4_ = fVar54 * *(float *)*pauVar21 + fVar46;
          auVar75._4_4_ = fVar71 * *(float *)(*pauVar21 + 4) + fVar47;
          auVar75._8_4_ = fVar70 * *(float *)(*pauVar21 + 8) + fVar48;
          auVar75._12_4_ = auVar38._12_4_ * *(float *)(*pauVar21 + 0xc) + fVar60;
          *pauVar21 = auVar75;
          pauVar21 = pauVar21 + 1;
        }
        for (; iVar26 < iVar23; iVar26 = iVar26 + 1) {
          *(float *)*pauVar21 = fVar45 * *(float *)*pauVar21 + fVar42;
          pauVar21 = (undefined1 (*) [16])(*pauVar21 + 4);
        }
        pfVar19 = pfVar19 + 1;
        pfVar33 = pfVar33 + 1;
      }
      iVar26 = (this->super_GroupNorm).group;
    }
  }
  return 0;
}

Assistant:

int GroupNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}